

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O1

void av1_nn_predict_avx2(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  uint num_inputs;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  float *pfVar27;
  int iVar28;
  float *pfVar29;
  int *piVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  float *pfVar37;
  int iVar38;
  ulong uVar39;
  float *pfVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar47 [16];
  float fVar46;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  __m128 out_l;
  __m256 hadd [2];
  float buf [2] [128];
  float *local_570;
  float *local_568;
  __m128 local_510;
  float local_500;
  float fStack_4fc;
  float afStack_4f8 [2];
  undefined1 auStack_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  int *local_478;
  int *local_470;
  NN_CONFIG *local_468;
  float local_460 [268];
  
  uVar33 = (ulong)(uint)nn_config->num_hidden_layers;
  if (-1 < nn_config->num_hidden_layers) {
    local_470 = &nn_config->num_outputs;
    local_478 = nn_config->num_hidden_nodes;
    uVar34 = 0;
    uVar39 = 0;
    uVar32 = (ulong)(uint)nn_config->num_inputs;
    local_570 = input_nodes;
    local_468 = nn_config;
    do {
      pfVar27 = local_468->weights[uVar39];
      pfVar40 = local_468->bias[uVar39];
      uVar33 = uVar33 & 0xffffffff;
      pfVar29 = local_460 + uVar34 * 0x80;
      if (uVar39 == uVar33) {
        pfVar29 = output;
      }
      piVar30 = local_478 + uVar39;
      if (uVar39 == uVar33) {
        piVar30 = local_470;
      }
      uVar3 = *piVar30;
      uVar43 = (ulong)uVar3;
      num_inputs = (uint)uVar32;
      uVar35 = num_inputs;
      if ((int)num_inputs < 0) {
        uVar35 = num_inputs + 7;
      }
      uVar36 = (int)num_inputs % 8;
      if (uVar36 == 0) {
        if ((uVar3 & 7) == 0) {
          if (0 < (int)uVar3) {
            iVar38 = 0;
            uVar32 = 0;
            do {
              pfVar37 = pfVar40 + uVar32;
              fVar46 = *pfVar37;
              fVar5 = pfVar37[1];
              fVar6 = pfVar37[2];
              fVar7 = pfVar37[3];
              fVar8 = pfVar37[4];
              fVar9 = pfVar37[5];
              fVar10 = pfVar37[6];
              fVar11 = pfVar37[7];
              auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar59 = ZEXT1632(ZEXT816(0) << 0x40);
              if (0 < (int)num_inputs) {
                lVar31 = 0;
                iVar42 = iVar38;
                do {
                  pfVar37 = local_570 + lVar31;
                  fVar12 = *pfVar37;
                  fVar13 = pfVar37[1];
                  fVar14 = pfVar37[2];
                  fVar15 = pfVar37[3];
                  fVar16 = pfVar37[4];
                  fVar17 = pfVar37[5];
                  fVar18 = pfVar37[6];
                  lVar41 = 0;
                  iVar28 = iVar42;
                  do {
                    pfVar37 = pfVar27 + iVar28;
                    auVar61._0_4_ = fVar12 * *pfVar37;
                    auVar61._4_4_ = fVar13 * pfVar37[1];
                    auVar61._8_4_ = fVar14 * pfVar37[2];
                    auVar61._12_4_ = fVar15 * pfVar37[3];
                    auVar61._16_4_ = fVar16 * pfVar37[4];
                    auVar61._20_4_ = fVar17 * pfVar37[5];
                    auVar61._28_36_ = in_ZMM3._28_36_;
                    auVar61._24_4_ = fVar18 * pfVar37[6];
                    pfVar37 = pfVar27 + (int)(num_inputs + iVar28);
                    auVar64._0_4_ = fVar12 * *pfVar37;
                    auVar64._4_4_ = fVar13 * pfVar37[1];
                    auVar64._8_4_ = fVar14 * pfVar37[2];
                    auVar64._12_4_ = fVar15 * pfVar37[3];
                    auVar64._16_4_ = fVar16 * pfVar37[4];
                    auVar64._20_4_ = fVar17 * pfVar37[5];
                    auVar64._28_36_ = in_ZMM4._28_36_;
                    auVar64._24_4_ = fVar18 * pfVar37[6];
                    in_ZMM4 = ZEXT3264(auVar64._0_32_);
                    auVar59 = vhaddps_avx(auVar61._0_32_,auVar64._0_32_);
                    in_ZMM3 = ZEXT3264(auVar59);
                    *(undefined1 (*) [32])((long)&local_500 + lVar41) = auVar59;
                    iVar28 = iVar28 + num_inputs * 2;
                    lVar41 = lVar41 + 0x20;
                  } while (lVar41 != 0x80);
                  auVar4._4_4_ = fStack_4fc;
                  auVar4._0_4_ = local_500;
                  auVar4._8_4_ = afStack_4f8[0];
                  auVar4._12_4_ = afStack_4f8[1];
                  auVar4._16_16_ = auStack_4f0;
                  auVar4 = vhaddps_avx(auVar4,local_4e0);
                  auVar54 = vhaddps_avx(local_4c0,local_4a0);
                  in_ZMM3 = ZEXT3264(auVar54);
                  in_ZMM4 = ZEXT3264(CONCAT1616(auVar54._0_16_,auVar4._0_16_));
                  auVar52 = vperm2f128_avx(auVar4,auVar54,0x31);
                  auVar59._0_4_ = auVar56._0_4_ + auVar4._0_4_ + auVar52._0_4_;
                  auVar59._4_4_ = auVar56._4_4_ + auVar4._4_4_ + auVar52._4_4_;
                  auVar59._8_4_ = auVar56._8_4_ + auVar4._8_4_ + auVar52._8_4_;
                  auVar59._12_4_ = auVar56._12_4_ + auVar4._12_4_ + auVar52._12_4_;
                  auVar59._16_4_ = auVar56._16_4_ + auVar54._0_4_ + auVar52._16_4_;
                  auVar59._20_4_ = auVar56._20_4_ + auVar54._4_4_ + auVar52._20_4_;
                  auVar59._24_4_ = auVar56._24_4_ + auVar54._8_4_ + auVar52._24_4_;
                  auVar59._28_4_ = auVar56._28_4_ + auVar54._12_4_ + auVar52._28_4_;
                  auVar56 = ZEXT3264(auVar59);
                  lVar31 = lVar31 + 8;
                  iVar42 = iVar42 + 8;
                } while (lVar31 < (int)num_inputs);
              }
              auVar54._0_4_ = fVar46 + auVar59._0_4_;
              auVar54._4_4_ = fVar5 + auVar59._4_4_;
              auVar54._8_4_ = fVar6 + auVar59._8_4_;
              auVar54._12_4_ = fVar7 + auVar59._12_4_;
              auVar54._16_4_ = fVar8 + auVar59._16_4_;
              auVar54._20_4_ = fVar9 + auVar59._20_4_;
              auVar54._24_4_ = fVar10 + auVar59._24_4_;
              auVar54._28_4_ = fVar11 + auVar59._28_4_;
              if (uVar39 != uVar33) {
                auVar54 = vmaxps_avx(auVar54,_DAT_00510fe0);
              }
              *(undefined1 (*) [32])(pfVar29 + uVar32) = auVar54;
              uVar32 = uVar32 + 8;
              iVar38 = iVar38 + num_inputs * 8;
            } while (uVar32 < uVar43);
          }
        }
        else if ((uVar3 & 3) == 0) {
          if (0 < (int)uVar3) {
            iVar38 = 0;
            uVar32 = 0;
            do {
              pfVar37 = pfVar40 + uVar32;
              fVar46 = *pfVar37;
              fVar5 = pfVar37[1];
              fVar6 = pfVar37[2];
              fVar7 = pfVar37[3];
              auVar57 = ZEXT816(0) << 0x40;
              if (0 < (int)num_inputs) {
                lVar31 = 0;
                iVar42 = iVar38;
                auVar47 = auVar57;
                do {
                  pfVar37 = local_570 + lVar31;
                  fVar8 = *pfVar37;
                  fVar9 = pfVar37[1];
                  fVar10 = pfVar37[2];
                  fVar11 = pfVar37[3];
                  fVar12 = pfVar37[4];
                  fVar13 = pfVar37[5];
                  fVar14 = pfVar37[6];
                  lVar41 = 0;
                  iVar28 = iVar42;
                  do {
                    pfVar37 = pfVar27 + iVar28;
                    auVar56._0_4_ = fVar8 * *pfVar37;
                    auVar56._4_4_ = fVar9 * pfVar37[1];
                    auVar56._8_4_ = fVar10 * pfVar37[2];
                    auVar56._12_4_ = fVar11 * pfVar37[3];
                    auVar56._16_4_ = fVar12 * pfVar37[4];
                    auVar56._20_4_ = fVar13 * pfVar37[5];
                    auVar56._28_36_ = in_ZMM3._28_36_;
                    auVar56._24_4_ = fVar14 * pfVar37[6];
                    pfVar37 = pfVar27 + (int)(num_inputs + iVar28);
                    auVar66._0_4_ = fVar8 * *pfVar37;
                    auVar66._4_4_ = fVar9 * pfVar37[1];
                    auVar66._8_4_ = fVar10 * pfVar37[2];
                    auVar66._12_4_ = fVar11 * pfVar37[3];
                    auVar66._16_4_ = fVar12 * pfVar37[4];
                    auVar66._20_4_ = fVar13 * pfVar37[5];
                    auVar66._28_36_ = in_ZMM4._28_36_;
                    auVar66._24_4_ = fVar14 * pfVar37[6];
                    in_ZMM4 = ZEXT3264(auVar66._0_32_);
                    auVar59 = vhaddps_avx(auVar56._0_32_,auVar66._0_32_);
                    in_ZMM3 = ZEXT3264(auVar59);
                    *(undefined1 (*) [32])((long)&local_500 + lVar41) = auVar59;
                    iVar28 = iVar28 + num_inputs * 2;
                    lVar41 = lVar41 + 0x20;
                  } while (lVar41 == 0x20);
                  auVar25._4_4_ = fStack_4fc;
                  auVar25._0_4_ = local_500;
                  auVar25._8_4_ = afStack_4f8[0];
                  auVar25._12_4_ = afStack_4f8[1];
                  auVar25._16_16_ = auStack_4f0;
                  auVar59 = vhaddps_avx(auVar25,local_4e0);
                  in_ZMM3 = ZEXT1664(auVar59._16_16_);
                  auVar57._0_4_ = auVar47._0_4_ + auVar59._0_4_ + auVar59._16_4_;
                  auVar57._4_4_ = auVar47._4_4_ + auVar59._4_4_ + auVar59._20_4_;
                  auVar57._8_4_ = auVar47._8_4_ + auVar59._8_4_ + auVar59._24_4_;
                  auVar57._12_4_ = auVar47._12_4_ + auVar59._12_4_ + auVar59._28_4_;
                  lVar31 = lVar31 + 8;
                  iVar42 = iVar42 + 8;
                  auVar47 = auVar57;
                } while (lVar31 < (int)num_inputs);
              }
              auVar49._0_4_ = fVar46 + auVar57._0_4_;
              auVar49._4_4_ = fVar5 + auVar57._4_4_;
              auVar49._8_4_ = fVar6 + auVar57._8_4_;
              auVar49._12_4_ = fVar7 + auVar57._12_4_;
              if (uVar39 != uVar33) {
                auVar49 = vmaxps_avx(auVar49,_DAT_004cb8e0);
              }
              *(undefined1 (*) [16])(pfVar29 + uVar32) = auVar49;
              uVar32 = uVar32 + 4;
              iVar38 = iVar38 + num_inputs * 4;
            } while (uVar32 < uVar43);
          }
        }
        else if (0 < (int)uVar3) {
          uVar32 = 0;
          do {
            auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar52 = ZEXT1632(ZEXT816(0) << 0x40);
            if (0 < (int)num_inputs) {
              lVar31 = 0;
              do {
                pfVar37 = local_570 + lVar31;
                pfVar1 = pfVar27 + lVar31;
                auVar52._0_4_ = auVar56._0_4_ + *pfVar37 * *pfVar1;
                auVar52._4_4_ = auVar56._4_4_ + pfVar37[1] * pfVar1[1];
                auVar52._8_4_ = auVar56._8_4_ + pfVar37[2] * pfVar1[2];
                auVar52._12_4_ = auVar56._12_4_ + pfVar37[3] * pfVar1[3];
                auVar52._16_4_ = auVar56._16_4_ + pfVar37[4] * pfVar1[4];
                auVar52._20_4_ = auVar56._20_4_ + pfVar37[5] * pfVar1[5];
                auVar52._24_4_ = auVar56._24_4_ + pfVar37[6] * pfVar1[6];
                auVar52._28_4_ = auVar56._28_4_ + pfVar37[7];
                auVar56 = ZEXT3264(auVar52);
                lVar31 = lVar31 + 8;
              } while (lVar31 < (int)num_inputs);
            }
            auVar47._0_4_ = auVar52._0_4_ + auVar52._16_4_;
            auVar47._4_4_ = auVar52._4_4_ + auVar52._20_4_;
            auVar47._8_4_ = auVar52._8_4_ + auVar52._24_4_;
            auVar47._12_4_ = auVar52._12_4_ + auVar52._28_4_;
            auVar47 = vhaddps_avx(auVar47,auVar47);
            auVar47 = vhaddps_avx(auVar47,auVar47);
            fVar46 = auVar47._0_4_ + pfVar40[uVar32];
            if (uVar39 != uVar33) {
              auVar47 = vmaxss_avx(ZEXT416((uint)fVar46),ZEXT416(0));
              fVar46 = auVar47._0_4_;
            }
            pfVar29[uVar32] = fVar46;
            uVar32 = uVar32 + 1;
            pfVar27 = pfVar27 + (int)num_inputs;
          } while (uVar32 != uVar43);
        }
      }
      else {
        uVar35 = ((int)uVar35 >> 3) << 3;
        local_568 = pfVar40;
        if (0xe < num_inputs + 7) {
          bVar44 = uVar39 != uVar33;
          bVar45 = uVar35 == num_inputs;
          local_568 = pfVar29;
          if ((uVar3 & 7) == 0) {
            if (0 < (int)uVar3) {
              iVar38 = 0;
              uVar32 = 0;
              do {
                pfVar37 = pfVar40 + uVar32;
                fVar46 = *pfVar37;
                fVar5 = pfVar37[1];
                fVar6 = pfVar37[2];
                fVar7 = pfVar37[3];
                fVar8 = pfVar37[4];
                fVar9 = pfVar37[5];
                fVar10 = pfVar37[6];
                fVar11 = pfVar37[7];
                auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar60 = ZEXT1632(ZEXT816(0) << 0x40);
                if (7 < (int)num_inputs) {
                  lVar31 = 0;
                  iVar42 = iVar38;
                  do {
                    pfVar37 = local_570 + lVar31;
                    fVar12 = *pfVar37;
                    fVar13 = pfVar37[1];
                    fVar14 = pfVar37[2];
                    fVar15 = pfVar37[3];
                    fVar16 = pfVar37[4];
                    fVar17 = pfVar37[5];
                    fVar18 = pfVar37[6];
                    lVar41 = 0;
                    iVar28 = iVar42;
                    do {
                      pfVar37 = pfVar27 + iVar28;
                      auVar62._0_4_ = fVar12 * *pfVar37;
                      auVar62._4_4_ = fVar13 * pfVar37[1];
                      auVar62._8_4_ = fVar14 * pfVar37[2];
                      auVar62._12_4_ = fVar15 * pfVar37[3];
                      auVar62._16_4_ = fVar16 * pfVar37[4];
                      auVar62._20_4_ = fVar17 * pfVar37[5];
                      auVar62._28_36_ = in_ZMM3._28_36_;
                      auVar62._24_4_ = fVar18 * pfVar37[6];
                      pfVar37 = pfVar27 + (int)(num_inputs + iVar28);
                      auVar65._0_4_ = fVar12 * *pfVar37;
                      auVar65._4_4_ = fVar13 * pfVar37[1];
                      auVar65._8_4_ = fVar14 * pfVar37[2];
                      auVar65._12_4_ = fVar15 * pfVar37[3];
                      auVar65._16_4_ = fVar16 * pfVar37[4];
                      auVar65._20_4_ = fVar17 * pfVar37[5];
                      auVar65._28_36_ = in_ZMM4._28_36_;
                      auVar65._24_4_ = fVar18 * pfVar37[6];
                      in_ZMM4 = ZEXT3264(auVar65._0_32_);
                      auVar59 = vhaddps_avx(auVar62._0_32_,auVar65._0_32_);
                      in_ZMM3 = ZEXT3264(auVar59);
                      *(undefined1 (*) [32])((long)&local_500 + lVar41) = auVar59;
                      iVar28 = iVar28 + num_inputs * 2;
                      lVar41 = lVar41 + 0x20;
                    } while (lVar41 != 0x80);
                    auVar24._4_4_ = fStack_4fc;
                    auVar24._0_4_ = local_500;
                    auVar24._8_4_ = afStack_4f8[0];
                    auVar24._12_4_ = afStack_4f8[1];
                    auVar24._16_16_ = auStack_4f0;
                    auVar59 = vhaddps_avx(auVar24,local_4e0);
                    auVar4 = vhaddps_avx(local_4c0,local_4a0);
                    in_ZMM3 = ZEXT3264(auVar4);
                    in_ZMM4 = ZEXT3264(CONCAT1616(auVar4._0_16_,auVar59._0_16_));
                    auVar54 = vperm2f128_avx(auVar59,auVar4,0x31);
                    auVar60._0_4_ = auVar56._0_4_ + auVar59._0_4_ + auVar54._0_4_;
                    auVar60._4_4_ = auVar56._4_4_ + auVar59._4_4_ + auVar54._4_4_;
                    auVar60._8_4_ = auVar56._8_4_ + auVar59._8_4_ + auVar54._8_4_;
                    auVar60._12_4_ = auVar56._12_4_ + auVar59._12_4_ + auVar54._12_4_;
                    auVar60._16_4_ = auVar56._16_4_ + auVar4._0_4_ + auVar54._16_4_;
                    auVar60._20_4_ = auVar56._20_4_ + auVar4._4_4_ + auVar54._20_4_;
                    auVar60._24_4_ = auVar56._24_4_ + auVar4._8_4_ + auVar54._24_4_;
                    auVar60._28_4_ = auVar56._28_4_ + auVar4._12_4_ + auVar54._28_4_;
                    auVar56 = ZEXT3264(auVar60);
                    lVar31 = lVar31 + 8;
                    iVar42 = iVar42 + 8;
                  } while (lVar31 < (int)uVar35);
                }
                auVar55._0_4_ = fVar46 + auVar60._0_4_;
                auVar55._4_4_ = fVar5 + auVar60._4_4_;
                auVar55._8_4_ = fVar6 + auVar60._8_4_;
                auVar55._12_4_ = fVar7 + auVar60._12_4_;
                auVar55._16_4_ = fVar8 + auVar60._16_4_;
                auVar55._20_4_ = fVar9 + auVar60._20_4_;
                auVar55._24_4_ = fVar10 + auVar60._24_4_;
                auVar55._28_4_ = fVar11 + auVar60._28_4_;
                if (bVar45 && bVar44) {
                  auVar55 = vmaxps_avx(auVar55,_DAT_00510fe0);
                }
                *(undefined1 (*) [32])(pfVar29 + uVar32) = auVar55;
                uVar32 = uVar32 + 8;
                iVar38 = iVar38 + num_inputs * 8;
              } while (uVar32 < uVar43);
            }
          }
          else if ((uVar3 & 3) == 0) {
            if (0 < (int)uVar3) {
              iVar38 = 0;
              uVar32 = 0;
              do {
                pfVar37 = pfVar40 + uVar32;
                fVar46 = *pfVar37;
                fVar5 = pfVar37[1];
                fVar6 = pfVar37[2];
                fVar7 = pfVar37[3];
                auVar58 = ZEXT816(0) << 0x40;
                if (7 < (int)num_inputs) {
                  lVar31 = 0;
                  iVar42 = iVar38;
                  auVar47 = auVar58;
                  do {
                    pfVar37 = local_570 + lVar31;
                    fVar8 = *pfVar37;
                    fVar9 = pfVar37[1];
                    fVar10 = pfVar37[2];
                    fVar11 = pfVar37[3];
                    fVar12 = pfVar37[4];
                    fVar13 = pfVar37[5];
                    fVar14 = pfVar37[6];
                    lVar41 = 0;
                    iVar28 = iVar42;
                    do {
                      pfVar37 = pfVar27 + iVar28;
                      auVar63._0_4_ = fVar8 * *pfVar37;
                      auVar63._4_4_ = fVar9 * pfVar37[1];
                      auVar63._8_4_ = fVar10 * pfVar37[2];
                      auVar63._12_4_ = fVar11 * pfVar37[3];
                      auVar63._16_4_ = fVar12 * pfVar37[4];
                      auVar63._20_4_ = fVar13 * pfVar37[5];
                      auVar63._28_36_ = in_ZMM3._28_36_;
                      auVar63._24_4_ = fVar14 * pfVar37[6];
                      pfVar37 = pfVar27 + (int)(num_inputs + iVar28);
                      auVar67._0_4_ = fVar8 * *pfVar37;
                      auVar67._4_4_ = fVar9 * pfVar37[1];
                      auVar67._8_4_ = fVar10 * pfVar37[2];
                      auVar67._12_4_ = fVar11 * pfVar37[3];
                      auVar67._16_4_ = fVar12 * pfVar37[4];
                      auVar67._20_4_ = fVar13 * pfVar37[5];
                      auVar67._28_36_ = in_ZMM4._28_36_;
                      auVar67._24_4_ = fVar14 * pfVar37[6];
                      in_ZMM4 = ZEXT3264(auVar67._0_32_);
                      auVar59 = vhaddps_avx(auVar63._0_32_,auVar67._0_32_);
                      in_ZMM3 = ZEXT3264(auVar59);
                      *(undefined1 (*) [32])((long)&local_500 + lVar41) = auVar59;
                      iVar28 = iVar28 + num_inputs * 2;
                      lVar41 = lVar41 + 0x20;
                    } while (lVar41 == 0x20);
                    auVar26._4_4_ = fStack_4fc;
                    auVar26._0_4_ = local_500;
                    auVar26._8_4_ = afStack_4f8[0];
                    auVar26._12_4_ = afStack_4f8[1];
                    auVar26._16_16_ = auStack_4f0;
                    auVar59 = vhaddps_avx(auVar26,local_4e0);
                    in_ZMM3 = ZEXT1664(auVar59._16_16_);
                    auVar58._0_4_ = auVar47._0_4_ + auVar59._0_4_ + auVar59._16_4_;
                    auVar58._4_4_ = auVar47._4_4_ + auVar59._4_4_ + auVar59._20_4_;
                    auVar58._8_4_ = auVar47._8_4_ + auVar59._8_4_ + auVar59._24_4_;
                    auVar58._12_4_ = auVar47._12_4_ + auVar59._12_4_ + auVar59._28_4_;
                    lVar31 = lVar31 + 8;
                    iVar42 = iVar42 + 8;
                    auVar47 = auVar58;
                  } while (lVar31 < (int)uVar35);
                }
                auVar50._0_4_ = fVar46 + auVar58._0_4_;
                auVar50._4_4_ = fVar5 + auVar58._4_4_;
                auVar50._8_4_ = fVar6 + auVar58._8_4_;
                auVar50._12_4_ = fVar7 + auVar58._12_4_;
                if (bVar45 && bVar44) {
                  auVar50 = vmaxps_avx(auVar50,_DAT_004cb8e0);
                }
                *(undefined1 (*) [16])(pfVar29 + uVar32) = auVar50;
                uVar32 = uVar32 + 4;
                iVar38 = iVar38 + num_inputs * 4;
              } while (uVar32 < uVar43);
            }
          }
          else if (0 < (int)uVar3) {
            uVar32 = 0;
            pfVar37 = pfVar27;
            do {
              auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar53 = ZEXT1632(ZEXT816(0) << 0x40);
              if (7 < (int)num_inputs) {
                lVar31 = 0;
                do {
                  pfVar1 = local_570 + lVar31;
                  pfVar2 = pfVar37 + lVar31;
                  auVar53._0_4_ = auVar56._0_4_ + *pfVar1 * *pfVar2;
                  auVar53._4_4_ = auVar56._4_4_ + pfVar1[1] * pfVar2[1];
                  auVar53._8_4_ = auVar56._8_4_ + pfVar1[2] * pfVar2[2];
                  auVar53._12_4_ = auVar56._12_4_ + pfVar1[3] * pfVar2[3];
                  auVar53._16_4_ = auVar56._16_4_ + pfVar1[4] * pfVar2[4];
                  auVar53._20_4_ = auVar56._20_4_ + pfVar1[5] * pfVar2[5];
                  auVar53._24_4_ = auVar56._24_4_ + pfVar1[6] * pfVar2[6];
                  auVar53._28_4_ = auVar56._28_4_ + pfVar1[7];
                  auVar56 = ZEXT3264(auVar53);
                  lVar31 = lVar31 + 8;
                } while (lVar31 < (int)uVar35);
              }
              auVar48._0_4_ = auVar53._0_4_ + auVar53._16_4_;
              auVar48._4_4_ = auVar53._4_4_ + auVar53._20_4_;
              auVar48._8_4_ = auVar53._8_4_ + auVar53._24_4_;
              auVar48._12_4_ = auVar53._12_4_ + auVar53._28_4_;
              auVar47 = vhaddps_avx(auVar48,auVar48);
              auVar47 = vhaddps_avx(auVar47,auVar47);
              fVar46 = auVar47._0_4_ + pfVar40[uVar32];
              if (bVar45 && bVar44) {
                auVar47 = vmaxss_avx(ZEXT416((uint)fVar46),ZEXT416(0));
                fVar46 = auVar47._0_4_;
              }
              pfVar29[uVar32] = fVar46;
              uVar32 = uVar32 + 1;
              pfVar37 = pfVar37 + (int)num_inputs;
            } while (uVar32 != uVar43);
          }
        }
        if ((uVar3 & 7) == 0 && (uVar36 & 3) == 0) {
          if (0 < (int)uVar3) {
            lVar31 = (long)(int)uVar35;
            pfVar27 = pfVar27 + lVar31;
            uVar32 = 0;
            do {
              uVar19 = *(undefined8 *)(local_568 + uVar32 + 4);
              afStack_4f8 = *(float (*) [2])(local_568 + uVar32 + 4 + 2);
              local_500 = (float)uVar19;
              fStack_4fc = (float)((ulong)uVar19 >> 0x20);
              local_510 = *(__m128 *)(local_568 + uVar32);
              pfVar40 = pfVar27;
              lVar41 = lVar31;
              pfVar37 = local_570 + lVar31;
              if ((int)uVar35 < (int)num_inputs) {
                do {
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                  av1_nn_propagate_4to8_sse3
                            (pfVar37,pfVar40,(__m128 *)&local_500,&local_510,num_inputs);
                  lVar41 = lVar41 + 4;
                  pfVar40 = pfVar40 + 4;
                  pfVar37 = pfVar37 + 4;
                } while (lVar41 < (int)num_inputs);
              }
              if (uVar39 != uVar33) {
                auVar20._4_4_ = fStack_4fc;
                auVar20._0_4_ = local_500;
                auVar20._8_4_ = afStack_4f8[0];
                auVar20._12_4_ = afStack_4f8[1];
                auVar47 = vmaxps_avx(auVar20,ZEXT816(0) << 0x40);
                local_500 = auVar47._0_4_;
                fStack_4fc = auVar47._4_4_;
                afStack_4f8 = auVar47._8_8_;
                local_510 = (__m128)vmaxps_avx((undefined1  [16])local_510,ZEXT816(0) << 0x40);
              }
              *(ulong *)(pfVar29 + (uVar32 | 4)) = CONCAT44(fStack_4fc,local_500);
              *(float (*) [2])(pfVar29 + (uVar32 | 4) + 2) = afStack_4f8;
              *(__m128 *)(pfVar29 + uVar32) = local_510;
              uVar32 = uVar32 + 8;
              pfVar27 = pfVar27 + (long)(int)num_inputs * 8;
            } while (uVar32 < uVar43);
          }
        }
        else if (((uVar36 | uVar3) & 3) == 0) {
          if (0 < (int)uVar3) {
            lVar31 = (long)(int)uVar35;
            pfVar27 = pfVar27 + lVar31;
            uVar32 = 0;
            do {
              uVar19 = *(undefined8 *)(local_568 + uVar32);
              afStack_4f8 = *(float (*) [2])(local_568 + uVar32 + 2);
              local_500 = (float)uVar19;
              fStack_4fc = (float)((ulong)uVar19 >> 0x20);
              pfVar40 = pfVar27;
              pfVar37 = local_570 + lVar31;
              lVar41 = lVar31;
              if ((int)uVar35 < (int)num_inputs) {
                do {
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                  av1_nn_propagate_4to4_sse3(pfVar37,pfVar40,(__m128 *)&local_500,num_inputs);
                  lVar41 = lVar41 + 4;
                  pfVar40 = pfVar40 + 4;
                  pfVar37 = pfVar37 + 4;
                } while (lVar41 < (int)num_inputs);
              }
              if (uVar39 != uVar33) {
                auVar21._4_4_ = fStack_4fc;
                auVar21._0_4_ = local_500;
                auVar21._8_4_ = afStack_4f8[0];
                auVar21._12_4_ = afStack_4f8[1];
                auVar47 = vmaxps_avx(auVar21,_DAT_004cb8e0);
                local_500 = auVar47._0_4_;
                fStack_4fc = auVar47._4_4_;
                afStack_4f8 = auVar47._8_8_;
              }
              auVar22._4_4_ = fStack_4fc;
              auVar22._0_4_ = local_500;
              auVar22._8_4_ = afStack_4f8[0];
              auVar22._12_4_ = afStack_4f8[1];
              *(undefined1 (*) [16])(pfVar29 + uVar32) = auVar22;
              uVar32 = uVar32 + 4;
              pfVar27 = pfVar27 + (long)(int)num_inputs * 4;
            } while (uVar32 < uVar43);
          }
        }
        else if ((uVar36 & 3) == 0) {
          if (0 < (int)uVar3) {
            lVar31 = (long)(int)uVar35;
            pfVar27 = pfVar27 + lVar31;
            uVar32 = 0;
            do {
              local_500 = local_568[uVar32];
              auVar51._4_4_ = local_500;
              auVar51._0_4_ = local_500;
              auVar51._8_4_ = local_500;
              auVar51._12_4_ = local_500;
              afStack_4f8 = auVar51._8_8_;
              pfVar40 = pfVar27;
              pfVar37 = local_570 + lVar31;
              lVar41 = lVar31;
              fStack_4fc = local_500;
              if ((int)uVar35 < (int)num_inputs) {
                do {
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                  av1_nn_propagate_4to1_sse3(pfVar37,pfVar40,(__m128 *)&local_500);
                  lVar41 = lVar41 + 4;
                  pfVar40 = pfVar40 + 4;
                  pfVar37 = pfVar37 + 4;
                } while (lVar41 < (int)num_inputs);
              }
              if (uVar39 != uVar33) {
                auVar23._4_4_ = fStack_4fc;
                auVar23._0_4_ = local_500;
                auVar23._8_4_ = afStack_4f8[0];
                auVar23._12_4_ = afStack_4f8[1];
                auVar47 = vmaxps_avx(auVar23,_DAT_004cb8e0);
                local_500 = auVar47._0_4_;
                fStack_4fc = auVar47._4_4_;
                afStack_4f8 = auVar47._8_8_;
              }
              pfVar29[uVar32] = local_500;
              uVar32 = uVar32 + 1;
              pfVar27 = pfVar27 + (int)num_inputs;
            } while (uVar32 != uVar43);
          }
        }
        else if (0 < (int)uVar3) {
          uVar32 = 0;
          do {
            fVar46 = local_568[uVar32];
            auVar56 = ZEXT1664(CONCAT412(fVar46,CONCAT48(fVar46,CONCAT44(fVar46,fVar46))));
            lVar31 = (long)(int)uVar35;
            if ((int)uVar35 < (int)num_inputs) {
              do {
                fVar46 = local_570[lVar31] * pfVar27[lVar31];
                auVar56 = ZEXT1664(CONCAT412(auVar56._12_4_ + fVar46,
                                             CONCAT48(auVar56._8_4_ + fVar46,
                                                      CONCAT44(auVar56._4_4_ + fVar46,
                                                               auVar56._0_4_ + fVar46))));
                lVar31 = lVar31 + 1;
              } while ((int)num_inputs != lVar31);
            }
            if (uVar39 != uVar33) {
              auVar47 = vmaxps_avx(auVar56._0_16_,_DAT_004cb8e0);
              auVar56 = ZEXT1664(auVar47);
            }
            pfVar29[uVar32] = auVar56._0_4_;
            uVar32 = uVar32 + 1;
            pfVar27 = pfVar27 + (int)num_inputs;
          } while (uVar32 != uVar43);
        }
      }
      uVar33 = (ulong)local_468->num_hidden_layers;
      uVar34 = (ulong)(1 - (int)uVar34);
      bVar44 = (long)uVar39 < (long)uVar33;
      nn_config = local_468;
      uVar39 = uVar39 + 1;
      uVar32 = uVar43;
      local_570 = pfVar29;
    } while (bVar44);
  }
  if (reduce_prec != 0) {
    av1_nn_output_prec_reduce(output,nn_config->num_outputs);
  }
  return;
}

Assistant:

void av1_nn_predict_avx2(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;
  assert(num_inputs > 0 && num_inputs <= NN_MAX_NODES_PER_LAYER);

  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool is_output_layer = layer == nn_config->num_hidden_layers;
    float *const output_nodes = is_output_layer ? output : &buf[buf_index][0];
    const int num_outputs = is_output_layer
                                ? nn_config->num_outputs
                                : nn_config->num_hidden_nodes[layer];
    assert(num_outputs > 0 && num_outputs <= NN_MAX_NODES_PER_LAYER);

    // Process input multiple of 8 using AVX2 intrinsic.
    if (num_inputs % 8 == 0) {
      nn_propagate_input_multiple_of_8(input_nodes, layer_weights, layer_bias,
                                       num_inputs, num_inputs, is_output_layer,
                                       num_outputs, output_nodes);
    } else {
      // When number of inputs is not multiple of 8, use hybrid approach of AVX2
      // and SSE3 based on the need.
      const int in_mul_8 = num_inputs / 8;
      const int num_inputs_to_process = in_mul_8 * 8;
      int bias_is_considered = 0;
      if (in_mul_8) {
        nn_propagate_input_multiple_of_8(
            input_nodes, layer_weights, layer_bias, num_inputs_to_process,
            num_inputs, is_output_layer, num_outputs, output_nodes);
        bias_is_considered = 1;
      }

      const float *out_temp = bias_is_considered ? output_nodes : layer_bias;
      const int input_remaining = num_inputs % 8;
      if (input_remaining % 4 == 0 && num_outputs % 8 == 0) {
        for (int out = 0; out < num_outputs; out += 8) {
          __m128 out_h = _mm_loadu_ps(&out_temp[out + 4]);
          __m128 out_l = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &out_h, &out_l, num_inputs);
          }
          if (!is_output_layer) {
            const __m128 zero = _mm_setzero_ps();
            out_h = _mm_max_ps(out_h, zero);
            out_l = _mm_max_ps(out_l, zero);
          }
          _mm_storeu_ps(&output_nodes[out + 4], out_h);
          _mm_storeu_ps(&output_nodes[out], out_l);
        }
      } else if (input_remaining % 4 == 0 && num_outputs % 4 == 0) {
        for (int out = 0; out < num_outputs; out += 4) {
          __m128 outputs = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs, num_inputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          _mm_storeu_ps(&output_nodes[out], outputs);
        }
      } else if (input_remaining % 4 == 0) {
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to1_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      } else {
        // Use SSE instructions for scalar operations to avoid the latency
        // of swapping between SIMD and FPU modes.
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in_node = in_mul_8 * 8; in_node < num_inputs; in_node++) {
            __m128 input = _mm_load1_ps(&input_nodes[in_node]);
            __m128 weight =
                _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
            outputs = _mm_add_ps(outputs, _mm_mul_ps(input, weight));
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      }
    }
    // Before processing the next layer, treat the output of current layer as
    // input to next layer.
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}